

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XInclude.cpp
# Opt level: O3

int main(int argC,char **argV)

{
  char *pcVar1;
  char *__s;
  char cVar2;
  ulong uVar3;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  size_t sVar7;
  long lVar8;
  LocalFileFormatTarget *this;
  ulong uVar9;
  XIncludeErrorHandler errorHandler;
  XMLCh errText [2048];
  
  if (1 < argC) {
    uVar3 = (ulong)(uint)argC;
    uVar9 = 1;
    do {
      pcVar1 = argV[uVar9];
      if ((*pcVar1 == '-') &&
         (((pcVar1[1] == '?' && (pcVar1[2] == '\0')) || ((pcVar1[1] == 'h' && (pcVar1[2] == '\0'))))
         )) goto LAB_00102347;
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
    if (argC != 2) {
      pcVar1 = argV[uVar3 - 2];
      __s = argV[uVar3 - 1];
      xercesc_4_0::XMLPlatformUtils::Initialize
                ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,
                 (PanicHandler *)0x0,(MemoryManager *)0x0);
      plVar4 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(L"LS");
      plVar5 = (long *)(**(code **)(*plVar4 + 0x10))
                                 (plVar4,1,0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0);
      plVar6 = (long *)(**(code **)(*plVar5 + 0x10))(plVar5);
      (**(code **)(*plVar6 + 8))(plVar6,&xercesc_4_0::XMLUni::fgDOMNamespaces,1);
      (**(code **)(*plVar6 + 8))(plVar6,&xercesc_4_0::XMLUni::fgXercesSchema,1);
      (**(code **)(*plVar6 + 8))(plVar6,&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports,1);
      (**(code **)(*plVar6 + 8))(plVar6,&xercesc_4_0::XMLUni::fgXercesSchemaFullChecking,1);
      cVar2 = (**(code **)(*plVar6 + 0x20))(plVar6,&xercesc_4_0::XMLUni::fgXercesDoXInclude,1);
      if (cVar2 != '\0') {
        (**(code **)(*plVar6 + 8))(plVar6,&xercesc_4_0::XMLUni::fgXercesDoXInclude,1);
      }
      (**(code **)*plVar6)(plVar6,&xercesc_4_0::XMLUni::fgDOMErrorHandler);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Parse ",6);
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106128);
      }
      else {
        sVar7 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," in progress ...",0x10);
      (**(code **)(*plVar5 + 0x68))(plVar5);
      lVar8 = (**(code **)(*plVar5 + 0x48))(plVar5,pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," finished.",10);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      if (lVar8 != 0) {
        plVar6 = (long *)(**(code **)(*plVar4 + 0x18))
                                   (plVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        plVar4 = (long *)(**(code **)(*plVar4 + 0x28))
                                   (plVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Writing result to: ",0x13);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106128);
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar7);
        }
        cVar2 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
        uVar3 = (ulong)(uint)(int)cVar2;
        std::ostream::put('(');
        std::ostream::flush();
        this = (LocalFileFormatTarget *)xercesc_4_0::XMemory::operator_new((XMemory *)0x30,uVar3);
        xercesc_4_0::LocalFileFormatTarget::LocalFileFormatTarget
                  (this,__s,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        (**(code **)(*plVar4 + 0x28))(plVar4,this);
        (**(code **)(*plVar6 + 0x38))(plVar6,lVar8 + 0x18,plVar4);
        (**(code **)(*(long *)this + 8))(this);
        (**(code **)(*plVar6 + 0x50))(plVar6);
        (**(code **)(*plVar4 + 0x40))(plVar4);
      }
      (**(code **)(*plVar5 + 0x60))(plVar5);
      xercesc_4_0::XMLPlatformUtils::Terminate();
      return 0;
    }
  }
LAB_00102347:
  usage();
  return 2;
}

Assistant:

int main(int argC, char* argV[])
{
	char						*testFileName;
	char						*outputFileName;

    for (int argInd = 1; argInd < argC; argInd++)
	{
        if (!strcmp(argV[argInd], "-?") || !strcmp(argV[argInd], "-h"))
        {
			/* print help and exit */
            usage();
            return 2;
        }
    }

	if (argC < 3){
		usage();
		return 2;
	}

	testFileName = argV[argC-2];
	outputFileName = argV[argC-1];

    // Initialize the XML4C system
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
         std::cerr << "Error during initialization! :\n"
              << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

	//============================================================================
	// Instantiate the DOM parser to use for the source documents
	//============================================================================
    static const XMLCh gLS[] = { chLatin_L, chLatin_S, chNull };
    DOMImplementation *impl = DOMImplementationRegistry::getDOMImplementation(gLS);
    DOMLSParser       *parser = ((DOMImplementationLS*)impl)->createLSParser(DOMImplementationLS::MODE_SYNCHRONOUS, 0);
    DOMConfiguration  *config = parser->getDomConfig();

    config->setParameter(XMLUni::fgDOMNamespaces, true);
    config->setParameter(XMLUni::fgXercesSchema, true);
    config->setParameter(XMLUni::fgXercesHandleMultipleImports, true);
    config->setParameter(XMLUni::fgXercesSchemaFullChecking, true);

    if(config->canSetParameter(XMLUni::fgXercesDoXInclude, true)){
      config->setParameter(XMLUni::fgXercesDoXInclude, true);
    }

    // enable datatype normalization - default is off
    //config->setParameter(XMLUni::fgDOMDatatypeNormalization, true);

    // And create our error handler and install it
    XIncludeErrorHandler errorHandler;
    config->setParameter(XMLUni::fgDOMErrorHandler, &errorHandler);

    xercesc::DOMDocument *doc = 0;

    try
    {
        // load up the test source document
		std::cerr << "Parse " << testFileName << " in progress ...";
        parser->resetDocumentPool();
		doc = parser->parseURI(testFileName);
		std::cerr << " finished." << std::endl;
    }
    catch (const XMLException& toCatch)
    {
        std::cerr << "\nError during parsing: '" << testFileName << "'\n"
                << "Exception message is:  \n"
                << StrX(toCatch.getMessage()) << "\n" << std::endl;
    }
    catch (const DOMException& toCatch)
    {
        const unsigned int maxChars = 2047;
        XMLCh errText[maxChars + 1];

        std::cerr << "\nDOM Error during parsing: '" << testFileName << "'\n"
                << "DOMException code is:  " << toCatch.code << std::endl;

        if (DOMImplementation::loadDOMExceptionMsg(toCatch.code, errText, maxChars))
                std::cerr << "Message is: " << StrX(errText) << std::endl;

    }
    catch (...)
    {
        std::cerr << "\nUnexpected exception during parsing: '" << testFileName << "'\n";
    }

    if (!errorHandler.getSawErrors() && doc) {
	    DOMLSSerializer	*writer = ((DOMImplementationLS*)impl)->createLSSerializer();
	    DOMLSOutput     *theOutputDesc = ((DOMImplementationLS*)impl)->createLSOutput();

		try {
			// write out the results
			std::cerr << "Writing result to: " << outputFileName << std::endl;

			XMLFormatTarget *myFormTarget = new LocalFileFormatTarget(outputFileName);
			theOutputDesc->setByteStream(myFormTarget);
			writer->write(doc, theOutputDesc);
            delete myFormTarget;
		}
		catch (const XMLException& toCatch)
		{
		    std::cerr << "\nXMLException during writing: '" << testFileName << "'\n"
				<< "Exception message is:  \n"
				<< StrX(toCatch.getMessage()) << "\n" << std::endl;
		}
		catch (const DOMException& toCatch)
		{
			const unsigned int maxChars = 2047;
			XMLCh errText[maxChars + 1];

			std::cerr << "\nDOM Error during writing: '" << testFileName << "'\n"
				<< "DOMException code is:  " << toCatch.code << std::endl;

			if (DOMImplementation::loadDOMExceptionMsg(toCatch.code, errText, maxChars))
				std::cerr << "Message is: " << StrX(errText) << std::endl;
		}
		catch (...)
		{
			std::cerr << "\nUnexpected exception during writing: '" << testFileName << "'\n";
		}
        writer->release();
        theOutputDesc->release();
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    parser->release();
	// And call the termination method
    XMLPlatformUtils::Terminate();

    return 0;
}